

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  bool bVar1;
  _Alloc_hider _Var2;
  string local_38;
  
  if (GetCustomObjectExtension()::extension_abi_cxx11_ == '\0') {
    GetCustomObjectExtension();
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CUDA_PTX_COMPILATION","");
  bVar1 = cmTarget::GetPropertyAsBool(this->Target,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    std::__cxx11::string::_M_replace
              (0x6aefc0,0,(char *)GetCustomObjectExtension()::extension_abi_cxx11_._M_string_length,
               0x55e355);
    _Var2 = GetCustomObjectExtension()::extension_abi_cxx11_._M_dataplus;
  }
  else {
    _Var2._M_p = (char *)0x0;
  }
  return _Var2._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  static std::string extension;
  const bool has_ptx_extension =
    this->GetPropertyAsBool("CUDA_PTX_COMPILATION");
  if (has_ptx_extension) {
    extension = ".ptx";
    return extension.c_str();
  }
  return nullptr;
}